

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs)

{
  pointer *pppcVar1;
  pointer *pppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *puVar4;
  cmake *pcVar5;
  iterator __position;
  iterator __position_00;
  pointer pcVar6;
  char *pcVar7;
  bool bVar8;
  int iVar9;
  cmMakefile *this_00;
  undefined4 extraout_var;
  Value *pVVar11;
  Value *pVVar12;
  mapped_type *pmVar13;
  long *plVar14;
  pointer pcVar15;
  iterator iVar16;
  string *psVar17;
  _func_int **pp_Var18;
  size_type *psVar19;
  pointer pcVar20;
  pointer pbVar21;
  key_type *pkVar22;
  key_type *__k;
  const_iterator cVar23;
  string target_mods_file;
  string ltmn;
  string local_658;
  string *local_638;
  cmGlobalNinjaGenerator *local_630;
  vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_> objects;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  mod_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_5d0;
  cmNinjaDeps ddOutputs;
  Value tm;
  iterator i;
  cmNinjaDeps ddImplicitDeps;
  cmNinjaDeps ddOrderOnlyDeps;
  cmNinjaDeps ddExplicitDeps;
  cmGeneratedFileStream tmf;
  cmGeneratedFileStream ddf;
  Value local_58;
  cmLocalGenerator *pcVar10;
  
  pcVar5 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (pcVar5->CurrentSnapshot).Position.Position;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(pcVar5->CurrentSnapshot).State;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (pcVar5->CurrentSnapshot).Position.Tree;
  local_638 = dir_top_bld;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&ddf,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&ddf,dir_cur_bld);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopSource
            ((cmStateDirectory *)&ddf,(dir_top_src->_M_dataplus)._M_p);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetRelativePathTopBinary((cmStateDirectory *)&ddf,(local_638->_M_dataplus)._M_p)
  ;
  this_00 = (cmMakefile *)operator_new(0x760);
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)this,(cmStateSnapshot *)&tmf);
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)this_00;
  iVar9 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2]
          )(this,this_00);
  mod_files._M_t._M_impl._0_8_ =
       ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  pcVar10 = (cmLocalGenerator *)CONCAT44(extraout_var,iVar9);
  ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  __position._M_current =
       (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
       super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
      super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)
               &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,__position,
               (cmMakefile **)&mod_files);
  }
  else {
    *__position._M_current = (cmMakefile *)mod_files._M_t._M_impl._0_8_;
    pppcVar1 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  __position_00._M_current =
       (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  mod_files._M_t._M_impl._0_8_ = pcVar10;
  local_630 = this;
  if (__position_00._M_current ==
      (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
    _M_realloc_insert<cmLocalGenerator*>
              ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
               &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
               __position_00,(cmLocalGenerator **)&mod_files);
  }
  else {
    *__position_00._M_current = pcVar10;
    pppcVar2 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar2 = *pppcVar2 + 1;
  }
  cm::auto_ptr<cmMakefile>::~auto_ptr((auto_ptr<cmMakefile> *)&ddf);
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar21 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar21 !=
      (arg_ddis->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    paVar3 = &target_mods_file.field_2;
    do {
      Json::Value::Value(&tm,nullValue);
      std::ifstream::ifstream(&ddf,(pbVar21->_M_dataplus)._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&tmf);
      bVar8 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false);
      local_638 = (string *)CONCAT71(local_638._1_7_,bVar8);
      if (bVar8) {
        mod_files._M_t._M_impl._0_8_ =
             &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             ((ulong)mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffffffffff00);
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_5d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pVVar11 = Json::Value::operator[](&tm,"object");
        Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar11);
        std::__cxx11::string::operator=((string *)&mod_files,(string *)&target_mods_file);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != paVar3) {
          operator_delete(target_mods_file._M_dataplus._M_p,
                          target_mods_file.field_2._M_allocated_capacity + 1);
        }
        pVVar11 = Json::Value::operator[](&tm,"provides");
        bVar8 = Json::Value::isArray(pVVar11);
        if (bVar8) {
          cVar23 = Json::Value::begin(pVVar11);
          ltmn._M_dataplus._M_p = (pointer)cVar23.super_ValueIteratorBase.current_._M_node;
          ltmn._M_string_length._0_1_ = cVar23.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar23 = Json::Value::end(pVVar11);
            target_mods_file._M_dataplus._M_p =
                 (pointer)cVar23.super_ValueIteratorBase.current_._M_node;
            target_mods_file._M_string_length =
                 CONCAT71(target_mods_file._M_string_length._1_7_,
                          cVar23.super_ValueIteratorBase.isNull_);
            bVar8 = Json::ValueIteratorBase::isEqual
                              ((ValueIteratorBase *)&ltmn,(SelfType *)&target_mods_file);
            if (bVar8) break;
            pVVar12 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar12);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                       &target_mods_file);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target_mods_file._M_dataplus._M_p != paVar3) {
              operator_delete(target_mods_file._M_dataplus._M_p,
                              target_mods_file.field_2._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
          }
        }
        pVVar11 = Json::Value::operator[](&tm,"requires");
        bVar8 = Json::Value::isArray(pVVar11);
        if (bVar8) {
          cVar23 = Json::Value::begin(pVVar11);
          ltmn._M_dataplus._M_p = (pointer)cVar23.super_ValueIteratorBase.current_._M_node;
          ltmn._M_string_length._0_1_ = cVar23.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar23 = Json::Value::end(pVVar11);
            target_mods_file._M_dataplus._M_p =
                 (pointer)cVar23.super_ValueIteratorBase.current_._M_node;
            target_mods_file._M_string_length =
                 CONCAT71(target_mods_file._M_string_length._1_7_,
                          cVar23.super_ValueIteratorBase.isNull_);
            bVar8 = Json::ValueIteratorBase::isEqual
                              ((ValueIteratorBase *)&ltmn,(SelfType *)&target_mods_file);
            if (bVar8) break;
            pVVar12 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&ltmn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar12);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &vStack_5d0,&target_mods_file);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target_mods_file._M_dataplus._M_p != paVar3) {
              operator_delete(target_mods_file._M_dataplus._M_p,
                              target_mods_file.field_2._M_allocated_capacity + 1);
            }
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&ltmn);
          }
        }
        std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::push_back
                  (&objects,(value_type *)&mod_files);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_5d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      }
      else {
        pcVar7 = (pbVar21->_M_dataplus)._M_p;
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)&mod_files,(Reader *)&tmf);
        cmSystemTools::Error
                  ("-E cmake_ninja_dyndep failed to parse ",pcVar7,
                   (char *)mod_files._M_t._M_impl._0_8_,(char *)0x0);
      }
      if ((_Base_ptr *)mod_files._M_t._M_impl._0_8_ !=
          &mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)mod_files._M_t._M_impl._0_8_,
                        (ulong)((long)&(mod_files._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _248_8_ + 1);
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _176_8_ + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      if ((char)local_638 == '\0') {
        bVar8 = false;
        goto LAB_003b18c0;
      }
      pbVar21 = pbVar21 + 1;
    } while (pbVar21 !=
             (arg_ddis->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mod_files._M_t._M_impl.super__Rb_tree_header._M_header;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       mod_files._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar17 = (linked_target_dirs->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (psVar17 !=
      (linked_target_dirs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ltmn._M_dataplus._M_p = (pointer)&ltmn.field_2;
      pcVar6 = (psVar17->_M_dataplus)._M_p;
      local_638 = psVar17;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ltmn,pcVar6,pcVar6 + psVar17->_M_string_length);
      std::__cxx11::string::append((char *)&ltmn);
      Json::Value::Value(&tm,nullValue);
      std::ifstream::ifstream(&ddf,ltmn._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&tmf);
      if ((((&ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
            [(long)ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                   _vptr_basic_ostream[-3]] & 5) == 0) &&
         (bVar8 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&tm,false), !bVar8)) {
        pcVar7 = (local_638->_M_dataplus)._M_p;
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&target_mods_file,(Reader *)&tmf);
        cmSystemTools::Error
                  ("-E cmake_ninja_dyndep failed to parse ",pcVar7,target_mods_file._M_dataplus._M_p
                   ,(char *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
          operator_delete(target_mods_file._M_dataplus._M_p,
                          target_mods_file.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)
            tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
            &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
          operator_delete((void *)tmf.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _248_8_ + 1);
        }
        if ((undefined1 *)
            tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
            &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
          operator_delete((void *)tmf.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _176_8_ + 1);
        }
        std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                  ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                   &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50
                  );
        std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                  ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
        std::ifstream::~ifstream(&ddf);
        Json::Value::~Value(&tm);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
          operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
        }
        bVar8 = false;
        goto LAB_003b18b3;
      }
      bVar8 = Json::Value::isObject(&tm);
      if (bVar8) {
        Json::Value::begin((Value *)&i);
        while( true ) {
          Json::Value::end((Value *)&target_mods_file);
          bVar8 = Json::ValueIteratorBase::isEqual
                            ((ValueIteratorBase *)&i,(SelfType *)&target_mods_file);
          if (bVar8) break;
          pVVar11 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&i);
          Json::Value::asString_abi_cxx11_(&local_658,pVVar11);
          Json::ValueIteratorBase::key((Value *)&target_mods_file,(ValueIteratorBase *)&i);
          Json::Value::asString_abi_cxx11_((string *)&ddOutputs,(Value *)&target_mods_file);
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&mod_files,(string *)&ddOutputs);
          std::__cxx11::string::operator=((string *)pmVar13,(string *)&local_658);
          if (ddOutputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&ddOutputs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(ddOutputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((ddOutputs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          Json::Value::~Value((Value *)&target_mods_file);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,
                            CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                     local_658.field_2._M_local_buf[0]) + 1);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&i);
        }
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._232_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._232_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _248_8_ + 1);
      }
      if ((undefined1 *)
          tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._160_8_ !=
          &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0xb0) {
        operator_delete((void *)tmf.super_ofstream.
                                super_basic_ostream<char,_std::char_traits<char>_>._160_8_,
                        tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                        _176_8_ + 1);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                ((deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> *)
                 &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x50);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&tmf);
      std::ifstream::~ifstream(&ddf);
      Json::Value::~Value(&tm);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
        operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
      }
      psVar17 = local_638 + 1;
    } while (psVar17 !=
             (linked_target_dirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  Json::Value::Value(&tm,objectValue);
  if (objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar4 = &ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    pcVar15 = objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pcVar20 = objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pkVar22 = (pcVar20->Provides).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pkVar22 !=
          (pcVar20->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
                         module_dir,pkVar22);
          plVar14 = (long *)std::__cxx11::string::append((char *)&tmf);
          pp_Var18 = (_func_int **)(plVar14 + 2);
          if ((_func_int **)*plVar14 == pp_Var18) {
            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var18
            ;
            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
                 plVar14[3];
            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream = (_func_int **)puVar4;
          }
          else {
            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *pp_Var18
            ;
            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream = (_func_int **)*plVar14;
          }
          ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = plVar14[1];
          *plVar14 = (long)pp_Var18;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          if (tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream !=
              (_func_int **)
              &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
            operator_delete(tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _16_8_ + 1);
          }
          pmVar13 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&mod_files,pkVar22);
          std::__cxx11::string::_M_assign((string *)pmVar13);
          Json::Value::Value(&local_58,(string *)&ddf);
          pVVar11 = Json::Value::operator[](&tm,pkVar22);
          Json::Value::operator=(pVVar11,&local_58);
          Json::Value::~Value(&local_58);
          if (ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream != (_func_int **)puVar4) {
            operator_delete(ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _vptr_basic_ostream,
                            ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                            _16_8_ + 1);
          }
          pkVar22 = pkVar22 + 1;
          pcVar15 = objects.
                    super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (pkVar22 !=
                 (pcVar20->Provides).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      pcVar20 = pcVar20 + 1;
    } while (pcVar20 != pcVar15);
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ddf,(arg_dd->_M_dataplus)._M_p,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&ddf,"ninja_dyndep_version = 1.0\n",0x1b);
  if (objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start !=
      objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar3 = &local_658.field_2;
    pcVar15 = objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
      target_mods_file._M_string_length = 0;
      target_mods_file.field_2._M_allocated_capacity =
           target_mods_file.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ltmn._M_dataplus._M_p = (pointer)&ltmn.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ltmn,"dyndep","");
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddOutputs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      i.super_ValueIteratorBase.current_._M_node = (_Base_ptr)0x0;
      i.super_ValueIteratorBase.isNull_ = false;
      i.super_ValueIteratorBase._9_7_ = 0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddExplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddImplicitDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ddOrderOnlyDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ &
           0xffffffff00000000;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
           &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ddOutputs,&pcVar15->Object);
      for (pkVar22 = (pcVar15->Provides).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pkVar22 !=
          (pcVar15->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pkVar22 = pkVar22 + 1) {
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&mod_files._M_t,pkVar22);
        ConvertToNinjaPath(&local_658,local_630,pmVar13);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&i,
                   &local_658);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != paVar3) {
          operator_delete(local_658._M_dataplus._M_p,
                          CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                   local_658.field_2._M_local_buf[0]) + 1);
        }
      }
      __k = (pcVar15->Requires).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if (__k != (pcVar15->Requires).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          iVar16 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&mod_files._M_t,__k);
          if ((_Rb_tree_header *)iVar16._M_node != &mod_files._M_t._M_impl.super__Rb_tree_header) {
            ConvertToNinjaPath(&local_658,local_630,(string *)(iVar16._M_node + 2));
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &ddImplicitDeps,&local_658);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_658._M_dataplus._M_p != paVar3) {
              operator_delete(local_658._M_dataplus._M_p,
                              CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                       local_658.field_2._M_local_buf[0]) + 1);
            }
          }
          __k = __k + 1;
        } while (__k != (pcVar15->Requires).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
        pkVar22 = (pcVar15->Provides).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if ((pcVar15->Provides).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != pkVar22) {
        local_658._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"restat","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&tmf,&local_658);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar13,0,(char *)pmVar13->_M_string_length,0x5fce18);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_658._M_dataplus._M_p != paVar3) {
          operator_delete(local_658._M_dataplus._M_p,
                          CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                   local_658.field_2._M_local_buf[0]) + 1);
        }
      }
      local_658._M_string_length = 0;
      local_658.field_2._M_local_buf[0] = '\0';
      local_658._M_dataplus._M_p = (pointer)paVar3;
      WriteBuild(local_630,(ostream *)&ddf,&target_mods_file,&ltmn,&ddOutputs,(cmNinjaDeps *)&i,
                 &ddExplicitDeps,&ddImplicitDeps,&ddOrderOnlyDeps,(cmNinjaVars *)&tmf,&local_658,0,
                 (bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_658._M_dataplus._M_p != paVar3) {
        operator_delete(local_658._M_dataplus._M_p,
                        CONCAT71(local_658.field_2._M_allocated_capacity._1_7_,
                                 local_658.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&tmf);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddOrderOnlyDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddImplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddExplicitDeps);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ddOutputs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ltmn._M_dataplus._M_p != &ltmn.field_2) {
        operator_delete(ltmn._M_dataplus._M_p,ltmn.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
        operator_delete(target_mods_file._M_dataplus._M_p,
                        target_mods_file.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = pcVar15 + 1;
    } while (pcVar15 !=
             objects.super__Vector_base<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  cmsys::SystemTools::GetFilenamePath((string *)&tmf,arg_dd);
  plVar14 = (long *)std::__cxx11::string::append((char *)&tmf);
  psVar19 = (size_type *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    target_mods_file.field_2._M_allocated_capacity = *psVar19;
    target_mods_file.field_2._8_8_ = plVar14[3];
    target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
  }
  else {
    target_mods_file.field_2._M_allocated_capacity = *psVar19;
    target_mods_file._M_dataplus._M_p = (pointer)*plVar14;
  }
  target_mods_file._M_string_length = plVar14[1];
  *plVar14 = (long)psVar19;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if (tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)
      &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream,
                    tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1
                   );
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&tmf,target_mods_file._M_dataplus._M_p,false,None);
  Json::operator<<((ostream *)&tmf,&tm);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)target_mods_file._M_dataplus._M_p != &target_mods_file.field_2) {
    operator_delete(target_mods_file._M_dataplus._M_p,
                    target_mods_file.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ddf);
  Json::Value::~Value(&tm);
  bVar8 = true;
LAB_003b18b3:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&mod_files._M_t);
LAB_003b18c0:
  std::vector<cmFortranObjectInfo,_std::allocator<cmFortranObjectInfo>_>::~vector(&objects);
  return bVar8;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    snapshot.GetDirectory().SetRelativePathTopSource(dir_top_src.c_str());
    snapshot.GetDirectory().SetRelativePathTopBinary(dir_top_bld.c_str());
    CM_AUTO_PTR<cmMakefile> mfd(new cmMakefile(this, snapshot));
    CM_AUTO_PTR<cmLocalNinjaGenerator> lgd(static_cast<cmLocalNinjaGenerator*>(
      this->CreateLocalGenerator(mfd.get())));
    this->Makefiles.push_back(mfd.release());
    this->LocalGenerators.push_back(lgd.release());
  }

  std::vector<cmFortranObjectInfo> objects;
  for (std::vector<std::string>::const_iterator ddii = arg_ddis.begin();
       ddii != arg_ddis.end(); ++ddii) {
    // Load the ddi file and compute the module file paths it provides.
    Json::Value ddio;
    Json::Value const& ddi = ddio;
    cmsys::ifstream ddif(ddii->c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(ddif, ddio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           ddii->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }

    cmFortranObjectInfo info;
    info.Object = ddi["object"].asString();
    Json::Value const& ddi_provides = ddi["provides"];
    if (ddi_provides.isArray()) {
      for (Json::Value::const_iterator i = ddi_provides.begin();
           i != ddi_provides.end(); ++i) {
        info.Provides.push_back(i->asString());
      }
    }
    Json::Value const& ddi_requires = ddi["requires"];
    if (ddi_requires.isArray()) {
      for (Json::Value::const_iterator i = ddi_requires.begin();
           i != ddi_requires.end(); ++i) {
        info.Requires.push_back(i->asString());
      }
    }
    objects.push_back(info);
  }

  // Map from module name to module file path, if known.
  std::map<std::string, std::string> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::vector<std::string>::const_iterator di =
         linked_target_dirs.begin();
       di != linked_target_dirs.end(); ++di) {
    std::string const ltmn = *di + "/FortranModules.json";
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (ltmf && !reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse ",
                           di->c_str(),
                           reader.getFormattedErrorMessages().c_str());
      return false;
    }
    if (ltm.isObject()) {
      for (Json::Value::iterator i = ltm.begin(); i != ltm.end(); ++i) {
        mod_files[i.key().asString()] = i->asString();
      }
    }
  }

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value tm = Json::objectValue;
  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      std::string const mod = module_dir + *i + ".mod";
      mod_files[*i] = mod;
      tm[*i] = mod;
    }
  }

  cmGeneratedFileStream ddf(arg_dd.c_str());
  ddf << "ninja_dyndep_version = 1.0\n";

  for (std::vector<cmFortranObjectInfo>::iterator oi = objects.begin();
       oi != objects.end(); ++oi) {
    std::string const ddComment;
    std::string const ddRule = "dyndep";
    cmNinjaDeps ddOutputs;
    cmNinjaDeps ddImplicitOuts;
    cmNinjaDeps ddExplicitDeps;
    cmNinjaDeps ddImplicitDeps;
    cmNinjaDeps ddOrderOnlyDeps;
    cmNinjaVars ddVars;

    ddOutputs.push_back(oi->Object);
    for (std::vector<std::string>::iterator i = oi->Provides.begin();
         i != oi->Provides.end(); ++i) {
      ddImplicitOuts.push_back(this->ConvertToNinjaPath(mod_files[*i]));
    }
    for (std::vector<std::string>::iterator i = oi->Requires.begin();
         i != oi->Requires.end(); ++i) {
      std::map<std::string, std::string>::iterator m = mod_files.find(*i);
      if (m != mod_files.end()) {
        ddImplicitDeps.push_back(this->ConvertToNinjaPath(m->second));
      }
    }
    if (!oi->Provides.empty()) {
      ddVars["restat"] = "1";
    }

    this->WriteBuild(ddf, ddComment, ddRule, ddOutputs, ddImplicitOuts,
                     ddExplicitDeps, ddImplicitDeps, ddOrderOnlyDeps, ddVars);
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file =
    cmSystemTools::GetFilenamePath(arg_dd) + "/FortranModules.json";
  cmGeneratedFileStream tmf(target_mods_file.c_str());
  tmf << tm;

  return true;
}